

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectOutline.cpp
# Opt level: O0

bool __thiscall Rml::FontEffectOutline::Initialise(FontEffectOutline *this,int _width)

{
  float *pfVar1;
  float fVar2;
  float local_28;
  float distance;
  float weight;
  int y;
  int x;
  int _width_local;
  FontEffectOutline *this_local;
  
  if (_width < 1) {
    this_local._7_1_ = false;
  }
  else {
    this->width = _width;
    ConvolutionFilter::Initialise(&this->filter,this->width,Dilation);
    for (weight = (float)-this->width; (int)weight <= this->width; weight = (float)((int)weight + 1)
        ) {
      for (distance = (float)-this->width; (int)distance <= this->width;
          distance = (float)((int)distance + 1)) {
        local_28 = 1.0;
        fVar2 = Math::SquareRoot((float)((int)weight * (int)weight + (int)distance * (int)distance))
        ;
        if ((float)this->width < fVar2) {
          local_28 = Math::Max<float>((float)(this->width + 1) - fVar2,0.0);
        }
        pfVar1 = ConvolutionFilter::operator[](&this->filter,(int)weight + this->width);
        pfVar1[(int)distance + this->width] = local_28;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FontEffectOutline::Initialise(int _width)
{
	if (_width <= 0)
		return false;

	width = _width;

	filter.Initialise(width, FilterOperation::Dilation);
	for (int x = -width; x <= width; ++x)
	{
		for (int y = -width; y <= width; ++y)
		{
			float weight = 1;

			float distance = Math::SquareRoot(float(x * x + y * y));
			if (distance > width)
			{
				weight = (width + 1) - distance;
				weight = Math::Max(weight, 0.0f);
			}

			filter[x + width][y + width] = weight;
		}
	}

	return true;
}